

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

void VP8IteratorImport(VP8EncIterator *it,uint8_t *tmp_32)

{
  int iVar1;
  int iVar2;
  WebPPicture *pWVar3;
  uint8_t uVar4;
  int iVar5;
  long lVar6;
  int w;
  uint8_t *src;
  uint8_t *src_00;
  int h;
  int h_00;
  uint8_t *src_01;
  
  iVar1 = it->x;
  iVar2 = it->y;
  pWVar3 = it->enc->pic;
  src_00 = pWVar3->y + (pWVar3->y_stride * iVar2 + iVar1) * 0x10;
  iVar5 = (pWVar3->uv_stride * iVar2 + iVar1) * 8;
  src_01 = pWVar3->u + iVar5;
  src = pWVar3->v + iVar5;
  iVar5 = pWVar3->width + iVar1 * -0x10;
  if (0xf < iVar5) {
    iVar5 = 0x10;
  }
  h = pWVar3->height + iVar2 * -0x10;
  if (0xf < h) {
    h = 0x10;
  }
  w = iVar5 + 1 >> 1;
  h_00 = h + 1 >> 1;
  ImportBlock(src_00,pWVar3->y_stride,it->yuv_in,iVar5,h,0x10);
  ImportBlock(src_01,pWVar3->uv_stride,it->yuv_in + 0x10,w,h_00,8);
  ImportBlock(src,pWVar3->uv_stride,it->yuv_in + 0x18,w,h_00,8);
  if (tmp_32 != (uint8_t *)0x0) {
    if (iVar1 == 0) {
      InitLeft(it);
    }
    else {
      if (iVar2 == 0) {
        uVar4 = '\x7f';
        it->v_left[-1] = '\x7f';
        it->u_left[-1] = '\x7f';
        lVar6 = 0x168;
      }
      else {
        it->y_left[-1] = src_00[~(long)pWVar3->y_stride];
        it->u_left[-1] = src_01[~(long)pWVar3->uv_stride];
        uVar4 = src[~(long)pWVar3->uv_stride];
        lVar6 = 0x178;
      }
      *(uint8_t *)(*(long *)(it->i4_boundary + lVar6 + -0x50) + -1) = uVar4;
      ImportLine(src_00 + -1,pWVar3->y_stride,it->y_left,h,0x10);
      ImportLine(src_01 + -1,pWVar3->uv_stride,it->u_left,h_00,8);
      ImportLine(src + -1,pWVar3->uv_stride,it->v_left,h_00,8);
    }
    it->y_top = tmp_32;
    it->uv_top = tmp_32 + 0x10;
    if (iVar2 != 0) {
      ImportLine(src_00 + -(long)pWVar3->y_stride,1,tmp_32,iVar5,0x10);
      ImportLine(src_01 + -(long)pWVar3->uv_stride,1,tmp_32 + 0x10,w,8);
      ImportLine(src + -(long)pWVar3->uv_stride,1,tmp_32 + 0x18,w,8);
      return;
    }
    builtin_memcpy(tmp_32,
                   "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   ,0x20);
  }
  return;
}

Assistant:

void VP8IteratorImport(VP8EncIterator* const it, uint8_t* const tmp_32) {
  const VP8Encoder* const enc = it->enc;
  const int x = it->x, y = it->y;
  const WebPPicture* const pic = enc->pic;
  const uint8_t* const ysrc = pic->y + (y * pic->y_stride  + x) * 16;
  const uint8_t* const usrc = pic->u + (y * pic->uv_stride + x) * 8;
  const uint8_t* const vsrc = pic->v + (y * pic->uv_stride + x) * 8;
  const int w = MinSize(pic->width - x * 16, 16);
  const int h = MinSize(pic->height - y * 16, 16);
  const int uv_w = (w + 1) >> 1;
  const int uv_h = (h + 1) >> 1;

  ImportBlock(ysrc, pic->y_stride,  it->yuv_in + Y_OFF_ENC, w, h, 16);
  ImportBlock(usrc, pic->uv_stride, it->yuv_in + U_OFF_ENC, uv_w, uv_h, 8);
  ImportBlock(vsrc, pic->uv_stride, it->yuv_in + V_OFF_ENC, uv_w, uv_h, 8);

  if (tmp_32 == NULL) return;

  // Import source (uncompressed) samples into boundary.
  if (x == 0) {
    InitLeft(it);
  } else {
    if (y == 0) {
      it->y_left[-1] = it->u_left[-1] = it->v_left[-1] = 127;
    } else {
      it->y_left[-1] = ysrc[- 1 - pic->y_stride];
      it->u_left[-1] = usrc[- 1 - pic->uv_stride];
      it->v_left[-1] = vsrc[- 1 - pic->uv_stride];
    }
    ImportLine(ysrc - 1, pic->y_stride,  it->y_left, h,   16);
    ImportLine(usrc - 1, pic->uv_stride, it->u_left, uv_h, 8);
    ImportLine(vsrc - 1, pic->uv_stride, it->v_left, uv_h, 8);
  }

  it->y_top  = tmp_32 + 0;
  it->uv_top = tmp_32 + 16;
  if (y == 0) {
    memset(tmp_32, 127, 32 * sizeof(*tmp_32));
  } else {
    ImportLine(ysrc - pic->y_stride,  1, tmp_32,          w,   16);
    ImportLine(usrc - pic->uv_stride, 1, tmp_32 + 16,     uv_w, 8);
    ImportLine(vsrc - pic->uv_stride, 1, tmp_32 + 16 + 8, uv_w, 8);
  }
}